

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNTree.cc
# Opt level: O2

iterator * __thiscall
NNTreeImpl::find(iterator *__return_storage_ptr__,NNTreeImpl *this,QPDFObjectHandle *key,
                bool return_prev_if_not_found)

{
  __shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> local_80 [5];
  
  std::__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (local_80,(__shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2> *)key);
  findInternal(__return_storage_ptr__,this,(QPDFObjectHandle *)local_80,return_prev_if_not_found);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_80[0]._M_refcount);
  return __return_storage_ptr__;
}

Assistant:

NNTreeImpl::iterator
NNTreeImpl::find(QPDFObjectHandle key, bool return_prev_if_not_found)
{
    try {
        return findInternal(key, return_prev_if_not_found);
    } catch (QPDFExc& e) {
        if (this->auto_repair) {
            QTC::TC("qpdf", "NNTree repair");
            warn(qpdf, this->oh, std::string("attempting to repair after error: ") + e.what());
            repair();
            return findInternal(key, return_prev_if_not_found);
        } else {
            throw;
        }
    }
}